

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O0

void test_ecdsa_end_to_end(void)

{
  char cVar1;
  int iVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  bool bVar5;
  secp256k1_pubkey pubkey2_1;
  uchar privkey_tmp_1 [32];
  uchar rnd_1 [32];
  int ret3_1;
  int ret2_1;
  int ret1_1;
  secp256k1_pubkey pubkey2;
  uchar privkey_tmp [32];
  uchar rnd [32];
  int ret3;
  int ret2;
  int ret1;
  secp256k1_scalar key;
  secp256k1_scalar msg;
  size_t seckeylen;
  uchar seckey [300];
  secp256k1_pubkey pubkey_tmp;
  secp256k1_pubkey pubkey;
  size_t pubkeyclen;
  uchar pubkeyc [65];
  size_t siglen;
  uchar sig [74];
  secp256k1_scalar s;
  secp256k1_scalar r;
  secp256k1_ecdsa_signature signature [6];
  uchar privkey2 [32];
  uchar message [32];
  uchar privkey [32];
  uchar extra [32];
  undefined4 in_stack_fffffffffffff9b8;
  int in_stack_fffffffffffff9bc;
  uchar *in_stack_fffffffffffff9c0;
  secp256k1_context *ctx;
  secp256k1_scalar *a;
  secp256k1_scalar *r_00;
  secp256k1_context *privkey_00;
  secp256k1_scalar *in_stack_fffffffffffff9e0;
  uchar *out32;
  secp256k1_context *in_stack_fffffffffffff9e8;
  secp256k1_ecdsa_signature *in_stack_fffffffffffff9f0;
  secp256k1_ecdsa_signature *in_stack_fffffffffffff9f8;
  secp256k1_ecdsa_signature *in_stack_fffffffffffffa00;
  undefined4 in_stack_fffffffffffffa08;
  int in_stack_fffffffffffffa0c;
  secp256k1_pubkey *in_stack_fffffffffffffa10;
  undefined4 in_stack_fffffffffffffa18;
  uint in_stack_fffffffffffffa1c;
  secp256k1_pubkey *in_stack_fffffffffffffa20;
  secp256k1_context *in_stack_fffffffffffffa28;
  secp256k1_nonce_function in_stack_fffffffffffffa30;
  secp256k1_context *in_stack_fffffffffffffa38;
  secp256k1_pubkey *in_stack_fffffffffffffa40;
  secp256k1_context *in_stack_fffffffffffffa48;
  secp256k1_context *in_stack_fffffffffffffa50;
  int in_stack_fffffffffffffa70;
  int in_stack_fffffffffffffa74;
  uchar *in_stack_fffffffffffffa78;
  secp256k1_ecdsa_signature *in_stack_fffffffffffffa80;
  secp256k1_context *in_stack_fffffffffffffa88;
  secp256k1_context *local_548;
  secp256k1_nonce_function local_540;
  secp256k1_context *local_538;
  secp256k1_pubkey *local_530;
  int local_4fc;
  int local_4f8;
  int local_4f4;
  undefined8 local_4b0;
  secp256k1_scalar local_4a8 [9];
  undefined1 local_370 [64];
  undefined1 local_330 [64];
  undefined8 local_2f0;
  uchar local_2e8 [72];
  undefined8 local_2a0;
  char local_298 [80];
  secp256k1_scalar local_248;
  secp256k1_scalar local_228;
  secp256k1_ecdsa_signature local_208;
  undefined1 auStack_1c8 [64];
  undefined1 auStack_188 [64];
  undefined1 auStack_148 [64];
  undefined1 auStack_108 [64];
  secp256k1_ecdsa_signature sStack_c8;
  undefined1 local_88 [64];
  secp256k1_scalar local_48;
  undefined1 local_28 [31];
  undefined1 local_9;
  
  memset(local_28,0,0x20);
  local_2a0 = 0x4a;
  local_2f0 = 0x41;
  local_4b0 = 300;
  random_scalar_order_test(in_stack_fffffffffffff9e0);
  random_scalar_order_test(in_stack_fffffffffffff9e0);
  secp256k1_scalar_get_b32
            (in_stack_fffffffffffff9c0,
             (secp256k1_scalar *)CONCAT44(in_stack_fffffffffffff9bc,in_stack_fffffffffffff9b8));
  secp256k1_scalar_get_b32
            (in_stack_fffffffffffff9c0,
             (secp256k1_scalar *)CONCAT44(in_stack_fffffffffffff9bc,in_stack_fffffffffffff9b8));
  iVar2 = secp256k1_ec_seckey_verify(in_stack_fffffffffffff9e8,(uchar *)in_stack_fffffffffffff9e0);
  if (iVar2 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x1a21,"test condition failed: secp256k1_ec_seckey_verify(CTX, privkey) == 1");
    abort();
  }
  iVar2 = secp256k1_ec_pubkey_create
                    (in_stack_fffffffffffffa48,in_stack_fffffffffffffa40,
                     (uchar *)in_stack_fffffffffffffa38);
  if (iVar2 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x1a22,"test condition failed: secp256k1_ec_pubkey_create(CTX, &pubkey, privkey) == 1")
    ;
    abort();
  }
  out32 = local_2e8;
  privkey_00 = CTX;
  secp256k1_testrand_bits(in_stack_fffffffffffff9bc);
  iVar2 = secp256k1_ec_pubkey_serialize
                    (in_stack_fffffffffffffa38,(uchar *)in_stack_fffffffffffffa30,
                     (size_t *)in_stack_fffffffffffffa28,in_stack_fffffffffffffa20,
                     in_stack_fffffffffffffa1c);
  if (iVar2 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x1a25,
            "test condition failed: secp256k1_ec_pubkey_serialize(CTX, pubkeyc, &pubkeyclen, &pubkey, secp256k1_testrand_bits(1) == 1 ? SECP256K1_EC_COMPRESSED : SECP256K1_EC_UNCOMPRESSED)"
           );
    abort();
  }
  memset(local_330,0,0x40);
  iVar2 = secp256k1_ec_pubkey_parse
                    (in_stack_fffffffffffffa28,in_stack_fffffffffffffa20,
                     (uchar *)CONCAT44(in_stack_fffffffffffffa1c,in_stack_fffffffffffffa18),
                     (size_t)in_stack_fffffffffffffa10);
  if (iVar2 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x1a27,
            "test condition failed: secp256k1_ec_pubkey_parse(CTX, &pubkey, pubkeyc, pubkeyclen) == 1"
           );
    abort();
  }
  memcpy(local_370,local_330,0x40);
  iVar2 = secp256k1_ec_pubkey_negate
                    ((secp256k1_context *)
                     CONCAT44(in_stack_fffffffffffffa1c,in_stack_fffffffffffffa18),
                     in_stack_fffffffffffffa10);
  if (iVar2 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x1a2b,"test condition failed: secp256k1_ec_pubkey_negate(CTX, &pubkey_tmp) == 1");
    abort();
  }
  iVar2 = secp256k1_memcmp_var(local_370,local_330,0x40);
  if (iVar2 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x1a2c,
            "test condition failed: secp256k1_memcmp_var(&pubkey_tmp, &pubkey, sizeof(pubkey)) != 0"
           );
    abort();
  }
  iVar2 = secp256k1_ec_pubkey_negate
                    ((secp256k1_context *)
                     CONCAT44(in_stack_fffffffffffffa1c,in_stack_fffffffffffffa18),
                     in_stack_fffffffffffffa10);
  if (iVar2 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x1a2d,"test condition failed: secp256k1_ec_pubkey_negate(CTX, &pubkey_tmp) == 1");
    abort();
  }
  iVar2 = secp256k1_memcmp_var(local_370,local_330,0x40);
  if (iVar2 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x1a2e,
            "test condition failed: secp256k1_memcmp_var(&pubkey_tmp, &pubkey, sizeof(pubkey)) == 0"
           );
    abort();
  }
  a = local_4a8;
  r_00 = &local_48;
  ctx = CTX;
  secp256k1_testrand_bits(in_stack_fffffffffffff9bc);
  iVar2 = ec_privkey_export_der
                    (in_stack_fffffffffffffa28,in_stack_fffffffffffffa20->data,
                     (size_t *)CONCAT44(in_stack_fffffffffffffa1c,in_stack_fffffffffffffa18),
                     in_stack_fffffffffffffa10->data,in_stack_fffffffffffffa0c);
  if (iVar2 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x1a31,
            "test condition failed: ec_privkey_export_der(CTX, seckey, &seckeylen, privkey, secp256k1_testrand_bits(1) == 1)"
           );
    abort();
  }
  iVar2 = ec_privkey_import_der(in_stack_fffffffffffff9e8,out32,(uchar *)privkey_00,(size_t)r_00);
  if (iVar2 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x1a32,
            "test condition failed: ec_privkey_import_der(CTX, privkey2, seckey, seckeylen) == 1");
    abort();
  }
  iVar2 = secp256k1_memcmp_var(&local_48,local_88,0x20);
  if (iVar2 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x1a33,"test condition failed: secp256k1_memcmp_var(privkey, privkey2, 32) == 0");
    abort();
  }
  uVar3 = secp256k1_testrand_int((uint32_t)((ulong)ctx >> 0x20));
  if (uVar3 == 0) {
    secp256k1_testrand256_test((uchar *)0x1449d3);
    local_548 = (secp256k1_context *)local_48.d[0];
    local_540 = (secp256k1_nonce_function)local_48.d[1];
    local_538 = (secp256k1_context *)local_48.d[2];
    local_530 = (secp256k1_pubkey *)local_48.d[3];
    local_4f4 = secp256k1_ec_seckey_tweak_add(in_stack_fffffffffffff9e8,out32,(uchar *)privkey_00);
    local_4f8 = secp256k1_ec_pubkey_tweak_add
                          (in_stack_fffffffffffffa28,in_stack_fffffffffffffa20,
                           (uchar *)CONCAT44(in_stack_fffffffffffffa1c,in_stack_fffffffffffffa18));
    local_4fc = secp256k1_ec_privkey_tweak_add
                          (ctx,(uchar *)CONCAT44(in_stack_fffffffffffff9bc,in_stack_fffffffffffff9b8
                                                ),(uchar *)0x144a75);
    if (local_4f4 != local_4f8) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
              ,0x1a43,"test condition failed: ret1 == ret2");
      abort();
    }
    if (local_4f8 != local_4fc) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
              ,0x1a44,"test condition failed: ret2 == ret3");
      abort();
    }
    if (local_4f4 == 0) {
      return;
    }
    iVar2 = secp256k1_memcmp_var(&local_48,&local_548,0x20);
    if (iVar2 != 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
              ,0x1a48,"test condition failed: secp256k1_memcmp_var(privkey, privkey_tmp, 32) == 0");
      abort();
    }
    iVar2 = secp256k1_ec_pubkey_create
                      (in_stack_fffffffffffffa48,in_stack_fffffffffffffa40,
                       (uchar *)in_stack_fffffffffffffa38);
    if (iVar2 != 1) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
              ,0x1a49,
              "test condition failed: secp256k1_ec_pubkey_create(CTX, &pubkey2, privkey) == 1");
      abort();
    }
    iVar2 = secp256k1_memcmp_var(local_330,&stack0xfffffffffffffa78,0x40);
    if (iVar2 != 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
              ,0x1a4a,
              "test condition failed: secp256k1_memcmp_var(&pubkey, &pubkey2, sizeof(pubkey)) == 0")
      ;
      abort();
    }
  }
  uVar3 = secp256k1_testrand_int((uint32_t)((ulong)ctx >> 0x20));
  if (uVar3 == 0) {
    secp256k1_testrand256_test((uchar *)0x144c88);
    in_stack_fffffffffffffa74 =
         secp256k1_ec_seckey_tweak_mul
                   ((secp256k1_context *)
                    CONCAT44(in_stack_fffffffffffffa1c,in_stack_fffffffffffffa18),
                    in_stack_fffffffffffffa10->data,
                    (uchar *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08));
    in_stack_fffffffffffffa70 =
         secp256k1_ec_pubkey_tweak_mul
                   (in_stack_fffffffffffffa48,(secp256k1_pubkey *)local_48.d[3],
                    (uchar *)local_48.d[2]);
    iVar2 = secp256k1_ec_privkey_tweak_mul
                      (ctx,(uchar *)CONCAT44(in_stack_fffffffffffff9bc,in_stack_fffffffffffff9b8),
                       (uchar *)0x144d21);
    if (in_stack_fffffffffffffa74 != in_stack_fffffffffffffa70) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
              ,0x1a5b,"test condition failed: ret1 == ret2");
      abort();
    }
    if (in_stack_fffffffffffffa70 != iVar2) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
              ,0x1a5c,"test condition failed: ret2 == ret3");
      abort();
    }
    if (in_stack_fffffffffffffa74 == 0) {
      return;
    }
    iVar2 = secp256k1_memcmp_var(&local_48,&stack0xfffffffffffffa28,0x20);
    if (iVar2 != 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
              ,0x1a60,"test condition failed: secp256k1_memcmp_var(privkey, privkey_tmp, 32) == 0");
      abort();
    }
    iVar2 = secp256k1_ec_pubkey_create
                      (in_stack_fffffffffffffa48,(secp256k1_pubkey *)local_48.d[3],
                       (uchar *)local_48.d[2]);
    if (iVar2 != 1) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
              ,0x1a61,
              "test condition failed: secp256k1_ec_pubkey_create(CTX, &pubkey2, privkey) == 1");
      abort();
    }
    iVar2 = secp256k1_memcmp_var(local_330,&stack0xfffffffffffff9e8,0x40);
    in_stack_fffffffffffffa28 = (secp256k1_context *)local_48.d[0];
    in_stack_fffffffffffffa30 = (secp256k1_nonce_function)local_48.d[1];
    in_stack_fffffffffffffa38 = (secp256k1_context *)local_48.d[2];
    in_stack_fffffffffffffa40 = (secp256k1_pubkey *)local_48.d[3];
    if (iVar2 != 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
              ,0x1a62,
              "test condition failed: secp256k1_memcmp_var(&pubkey, &pubkey2, sizeof(pubkey)) == 0")
      ;
      abort();
    }
  }
  uVar3 = (uint32_t)((ulong)ctx >> 0x20);
  iVar2 = secp256k1_ecdsa_sign
                    (in_stack_fffffffffffffa50,
                     (secp256k1_ecdsa_signature *)in_stack_fffffffffffffa48,
                     in_stack_fffffffffffffa40->data,(uchar *)in_stack_fffffffffffffa38,
                     in_stack_fffffffffffffa30,in_stack_fffffffffffffa28);
  if (iVar2 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x1a66,
            "test condition failed: secp256k1_ecdsa_sign(CTX, &signature[0], message, privkey, NULL, NULL) == 1"
           );
    abort();
  }
  iVar2 = secp256k1_ecdsa_sign
                    (in_stack_fffffffffffffa50,
                     (secp256k1_ecdsa_signature *)in_stack_fffffffffffffa48,
                     in_stack_fffffffffffffa40->data,(uchar *)in_stack_fffffffffffffa38,
                     in_stack_fffffffffffffa30,in_stack_fffffffffffffa28);
  if (iVar2 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x1a67,
            "test condition failed: secp256k1_ecdsa_sign(CTX, &signature[4], message, privkey, NULL, NULL) == 1"
           );
    abort();
  }
  iVar2 = secp256k1_ecdsa_sign
                    (in_stack_fffffffffffffa50,
                     (secp256k1_ecdsa_signature *)in_stack_fffffffffffffa48,
                     in_stack_fffffffffffffa40->data,(uchar *)in_stack_fffffffffffffa38,
                     in_stack_fffffffffffffa30,in_stack_fffffffffffffa28);
  if (iVar2 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x1a68,
            "test condition failed: secp256k1_ecdsa_sign(CTX, &signature[1], message, privkey, NULL, extra) == 1"
           );
    abort();
  }
  local_9 = 1;
  iVar2 = secp256k1_ecdsa_sign
                    (in_stack_fffffffffffffa50,
                     (secp256k1_ecdsa_signature *)in_stack_fffffffffffffa48,
                     in_stack_fffffffffffffa40->data,(uchar *)in_stack_fffffffffffffa38,
                     in_stack_fffffffffffffa30,in_stack_fffffffffffffa28);
  if (iVar2 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x1a6a,
            "test condition failed: secp256k1_ecdsa_sign(CTX, &signature[2], message, privkey, NULL, extra) == 1"
           );
    abort();
  }
  local_9 = 0;
  local_28[0] = 1;
  iVar2 = secp256k1_ecdsa_sign
                    (in_stack_fffffffffffffa50,
                     (secp256k1_ecdsa_signature *)in_stack_fffffffffffffa48,
                     in_stack_fffffffffffffa40->data,(uchar *)in_stack_fffffffffffffa38,
                     in_stack_fffffffffffffa30,in_stack_fffffffffffffa28);
  if (iVar2 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x1a6d,
            "test condition failed: secp256k1_ecdsa_sign(CTX, &signature[3], message, privkey, NULL, extra) == 1"
           );
    abort();
  }
  iVar2 = secp256k1_memcmp_var(&local_208,auStack_108,0x40);
  if (iVar2 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x1a6e,
            "test condition failed: secp256k1_memcmp_var(&signature[0], &signature[4], sizeof(signature[0])) == 0"
           );
    abort();
  }
  iVar2 = secp256k1_memcmp_var(&local_208,auStack_1c8,0x40);
  if (iVar2 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x1a6f,
            "test condition failed: secp256k1_memcmp_var(&signature[0], &signature[1], sizeof(signature[0])) != 0"
           );
    abort();
  }
  iVar2 = secp256k1_memcmp_var(&local_208,auStack_188,0x40);
  if (iVar2 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x1a70,
            "test condition failed: secp256k1_memcmp_var(&signature[0], &signature[2], sizeof(signature[0])) != 0"
           );
    abort();
  }
  iVar2 = secp256k1_memcmp_var(&local_208,auStack_148,0x40);
  if (iVar2 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x1a71,
            "test condition failed: secp256k1_memcmp_var(&signature[0], &signature[3], sizeof(signature[0])) != 0"
           );
    abort();
  }
  iVar2 = secp256k1_memcmp_var(auStack_1c8,auStack_188,0x40);
  if (iVar2 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x1a72,
            "test condition failed: secp256k1_memcmp_var(&signature[1], &signature[2], sizeof(signature[0])) != 0"
           );
    abort();
  }
  iVar2 = secp256k1_memcmp_var(auStack_1c8,auStack_148,0x40);
  if (iVar2 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x1a73,
            "test condition failed: secp256k1_memcmp_var(&signature[1], &signature[3], sizeof(signature[0])) != 0"
           );
    abort();
  }
  iVar2 = secp256k1_memcmp_var(auStack_188,auStack_148,0x40);
  if (iVar2 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x1a74,
            "test condition failed: secp256k1_memcmp_var(&signature[2], &signature[3], sizeof(signature[0])) != 0"
           );
    abort();
  }
  iVar2 = secp256k1_ecdsa_verify
                    (in_stack_fffffffffffffa88,in_stack_fffffffffffffa80,in_stack_fffffffffffffa78,
                     (secp256k1_pubkey *)
                     CONCAT44(in_stack_fffffffffffffa74,in_stack_fffffffffffffa70));
  if (iVar2 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x1a76,
            "test condition failed: secp256k1_ecdsa_verify(CTX, &signature[0], message, &pubkey) == 1"
           );
    abort();
  }
  iVar2 = secp256k1_ecdsa_verify
                    (in_stack_fffffffffffffa88,in_stack_fffffffffffffa80,in_stack_fffffffffffffa78,
                     (secp256k1_pubkey *)
                     CONCAT44(in_stack_fffffffffffffa74,in_stack_fffffffffffffa70));
  if (iVar2 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x1a77,
            "test condition failed: secp256k1_ecdsa_verify(CTX, &signature[1], message, &pubkey) == 1"
           );
    abort();
  }
  iVar2 = secp256k1_ecdsa_verify
                    (in_stack_fffffffffffffa88,in_stack_fffffffffffffa80,in_stack_fffffffffffffa78,
                     (secp256k1_pubkey *)
                     CONCAT44(in_stack_fffffffffffffa74,in_stack_fffffffffffffa70));
  if (iVar2 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x1a78,
            "test condition failed: secp256k1_ecdsa_verify(CTX, &signature[2], message, &pubkey) == 1"
           );
    abort();
  }
  iVar2 = secp256k1_ecdsa_verify
                    (in_stack_fffffffffffffa88,in_stack_fffffffffffffa80,in_stack_fffffffffffffa78,
                     (secp256k1_pubkey *)
                     CONCAT44(in_stack_fffffffffffffa74,in_stack_fffffffffffffa70));
  if (iVar2 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x1a79,
            "test condition failed: secp256k1_ecdsa_verify(CTX, &signature[3], message, &pubkey) == 1"
           );
    abort();
  }
  iVar2 = secp256k1_ecdsa_signature_normalize
                    ((secp256k1_context *)
                     CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08),
                     in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8);
  if (iVar2 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x1a7b,
            "test condition failed: !secp256k1_ecdsa_signature_normalize(CTX, NULL, &signature[0])")
    ;
    abort();
  }
  secp256k1_ecdsa_signature_load(CTX,&local_228,&local_248,&local_208);
  secp256k1_scalar_negate(r_00,a);
  secp256k1_ecdsa_signature_save(&sStack_c8,&local_228,&local_248);
  iVar2 = secp256k1_ecdsa_verify
                    (in_stack_fffffffffffffa88,in_stack_fffffffffffffa80,in_stack_fffffffffffffa78,
                     (secp256k1_pubkey *)
                     CONCAT44(in_stack_fffffffffffffa74,in_stack_fffffffffffffa70));
  if (iVar2 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x1a7f,
            "test condition failed: secp256k1_ecdsa_verify(CTX, &signature[5], message, &pubkey) == 0"
           );
    abort();
  }
  iVar2 = secp256k1_ecdsa_signature_normalize
                    ((secp256k1_context *)
                     CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08),
                     in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8);
  if (iVar2 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x1a80,
            "test condition failed: secp256k1_ecdsa_signature_normalize(CTX, NULL, &signature[5])");
    abort();
  }
  iVar2 = secp256k1_ecdsa_signature_normalize
                    ((secp256k1_context *)
                     CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08),
                     in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8);
  if (iVar2 != 0) {
    iVar2 = secp256k1_ecdsa_signature_normalize
                      ((secp256k1_context *)
                       CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08),
                       in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8);
    if (iVar2 != 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
              ,0x1a82,
              "test condition failed: !secp256k1_ecdsa_signature_normalize(CTX, NULL, &signature[5])"
             );
      abort();
    }
    iVar2 = secp256k1_ecdsa_signature_normalize
                      ((secp256k1_context *)
                       CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08),
                       in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8);
    if (iVar2 != 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
              ,0x1a83,
              "test condition failed: !secp256k1_ecdsa_signature_normalize(CTX, &signature[5], &signature[5])"
             );
      abort();
    }
    iVar2 = secp256k1_ecdsa_verify
                      (in_stack_fffffffffffffa88,in_stack_fffffffffffffa80,in_stack_fffffffffffffa78
                       ,(secp256k1_pubkey *)
                        CONCAT44(in_stack_fffffffffffffa74,in_stack_fffffffffffffa70));
    if (iVar2 != 1) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
              ,0x1a84,
              "test condition failed: secp256k1_ecdsa_verify(CTX, &signature[5], message, &pubkey) == 1"
             );
      abort();
    }
    secp256k1_scalar_negate(r_00,a);
    secp256k1_ecdsa_signature_save(&sStack_c8,&local_228,&local_248);
    iVar2 = secp256k1_ecdsa_signature_normalize
                      ((secp256k1_context *)
                       CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08),
                       in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8);
    if (iVar2 != 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
              ,0x1a87,
              "test condition failed: !secp256k1_ecdsa_signature_normalize(CTX, NULL, &signature[5])"
             );
      abort();
    }
    iVar2 = secp256k1_ecdsa_verify
                      (in_stack_fffffffffffffa88,in_stack_fffffffffffffa80,in_stack_fffffffffffffa78
                       ,(secp256k1_pubkey *)
                        CONCAT44(in_stack_fffffffffffffa74,in_stack_fffffffffffffa70));
    if (iVar2 != 1) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
              ,0x1a88,
              "test condition failed: secp256k1_ecdsa_verify(CTX, &signature[5], message, &pubkey) == 1"
             );
      abort();
    }
    iVar2 = secp256k1_memcmp_var(&sStack_c8,&local_208,0x40);
    if (iVar2 != 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
              ,0x1a89,
              "test condition failed: secp256k1_memcmp_var(&signature[5], &signature[0], 64) == 0");
      abort();
    }
    iVar2 = secp256k1_ecdsa_signature_serialize_der
                      ((secp256k1_context *)
                       CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08),
                       in_stack_fffffffffffffa00->data,(size_t *)in_stack_fffffffffffff9f8,
                       in_stack_fffffffffffff9f0);
    if (iVar2 != 1) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
              ,0x1a8c,
              "test condition failed: secp256k1_ecdsa_signature_serialize_der(CTX, sig, &siglen, &signature[0]) == 1"
             );
      abort();
    }
    memset(&local_208,0,0x40);
    iVar2 = secp256k1_ecdsa_signature_parse_der
                      ((secp256k1_context *)
                       CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08),
                       in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8->data,
                       (size_t)in_stack_fffffffffffff9f0);
    if (iVar2 == 1) {
      iVar2 = secp256k1_ecdsa_verify
                        (in_stack_fffffffffffffa88,in_stack_fffffffffffffa80,
                         in_stack_fffffffffffffa78,
                         (secp256k1_pubkey *)
                         CONCAT44(in_stack_fffffffffffffa74,in_stack_fffffffffffffa70));
      if (iVar2 != 1) {
        fprintf(_stderr,"%s:%d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
                ,0x1a8f,
                "test condition failed: secp256k1_ecdsa_verify(CTX, &signature[0], message, &pubkey) == 1"
               );
        abort();
      }
      local_2a0 = 0x4a;
      iVar2 = secp256k1_ecdsa_signature_serialize_der
                        ((secp256k1_context *)
                         CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08),
                         in_stack_fffffffffffffa00->data,(size_t *)in_stack_fffffffffffff9f8,
                         in_stack_fffffffffffff9f0);
      if (iVar2 == 1) {
        uVar4 = secp256k1_testrand_int(uVar3);
        cVar1 = (char)uVar4 + '\x01';
        uVar3 = secp256k1_testrand_int(uVar3);
        local_298[uVar3] = local_298[uVar3] + cVar1;
        iVar2 = secp256k1_ecdsa_signature_parse_der
                          ((secp256k1_context *)
                           CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08),
                           in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8->data,
                           (size_t)in_stack_fffffffffffff9f0);
        bVar5 = true;
        if (iVar2 != 0) {
          iVar2 = secp256k1_ecdsa_verify
                            (in_stack_fffffffffffffa88,in_stack_fffffffffffffa80,
                             in_stack_fffffffffffffa78,
                             (secp256k1_pubkey *)
                             CONCAT44(in_stack_fffffffffffffa74,in_stack_fffffffffffffa70));
          bVar5 = iVar2 == 0;
        }
        if (bVar5) {
          return;
        }
        fprintf(_stderr,"%s:%d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
                ,0x1a95,
                "test condition failed: secp256k1_ecdsa_signature_parse_der(CTX, &signature[0], sig, siglen) == 0 || secp256k1_ecdsa_verify(CTX, &signature[0], message, &pubkey) == 0"
               );
        abort();
      }
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
              ,0x1a92,
              "test condition failed: secp256k1_ecdsa_signature_serialize_der(CTX, sig, &siglen, &signature[0]) == 1"
             );
      abort();
    }
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x1a8e,
            "test condition failed: secp256k1_ecdsa_signature_parse_der(CTX, &signature[0], sig, siglen) == 1"
           );
    abort();
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
          ,0x1a81,
          "test condition failed: secp256k1_ecdsa_signature_normalize(CTX, &signature[5], &signature[5])"
         );
  abort();
}

Assistant:

static void test_ecdsa_end_to_end(void) {
    unsigned char extra[32] = {0x00};
    unsigned char privkey[32];
    unsigned char message[32];
    unsigned char privkey2[32];
    secp256k1_ecdsa_signature signature[6];
    secp256k1_scalar r, s;
    unsigned char sig[74];
    size_t siglen = 74;
    unsigned char pubkeyc[65];
    size_t pubkeyclen = 65;
    secp256k1_pubkey pubkey;
    secp256k1_pubkey pubkey_tmp;
    unsigned char seckey[300];
    size_t seckeylen = 300;

    /* Generate a random key and message. */
    {
        secp256k1_scalar msg, key;
        random_scalar_order_test(&msg);
        random_scalar_order_test(&key);
        secp256k1_scalar_get_b32(privkey, &key);
        secp256k1_scalar_get_b32(message, &msg);
    }

    /* Construct and verify corresponding public key. */
    CHECK(secp256k1_ec_seckey_verify(CTX, privkey) == 1);
    CHECK(secp256k1_ec_pubkey_create(CTX, &pubkey, privkey) == 1);

    /* Verify exporting and importing public key. */
    CHECK(secp256k1_ec_pubkey_serialize(CTX, pubkeyc, &pubkeyclen, &pubkey, secp256k1_testrand_bits(1) == 1 ? SECP256K1_EC_COMPRESSED : SECP256K1_EC_UNCOMPRESSED));
    memset(&pubkey, 0, sizeof(pubkey));
    CHECK(secp256k1_ec_pubkey_parse(CTX, &pubkey, pubkeyc, pubkeyclen) == 1);

    /* Verify negation changes the key and changes it back */
    memcpy(&pubkey_tmp, &pubkey, sizeof(pubkey));
    CHECK(secp256k1_ec_pubkey_negate(CTX, &pubkey_tmp) == 1);
    CHECK(secp256k1_memcmp_var(&pubkey_tmp, &pubkey, sizeof(pubkey)) != 0);
    CHECK(secp256k1_ec_pubkey_negate(CTX, &pubkey_tmp) == 1);
    CHECK(secp256k1_memcmp_var(&pubkey_tmp, &pubkey, sizeof(pubkey)) == 0);

    /* Verify private key import and export. */
    CHECK(ec_privkey_export_der(CTX, seckey, &seckeylen, privkey, secp256k1_testrand_bits(1) == 1));
    CHECK(ec_privkey_import_der(CTX, privkey2, seckey, seckeylen) == 1);
    CHECK(secp256k1_memcmp_var(privkey, privkey2, 32) == 0);

    /* Optionally tweak the keys using addition. */
    if (secp256k1_testrand_int(3) == 0) {
        int ret1;
        int ret2;
        int ret3;
        unsigned char rnd[32];
        unsigned char privkey_tmp[32];
        secp256k1_pubkey pubkey2;
        secp256k1_testrand256_test(rnd);
        memcpy(privkey_tmp, privkey, 32);
        ret1 = secp256k1_ec_seckey_tweak_add(CTX, privkey, rnd);
        ret2 = secp256k1_ec_pubkey_tweak_add(CTX, &pubkey, rnd);
        /* Check that privkey alias gives same result */
        ret3 = secp256k1_ec_privkey_tweak_add(CTX, privkey_tmp, rnd);
        CHECK(ret1 == ret2);
        CHECK(ret2 == ret3);
        if (ret1 == 0) {
            return;
        }
        CHECK(secp256k1_memcmp_var(privkey, privkey_tmp, 32) == 0);
        CHECK(secp256k1_ec_pubkey_create(CTX, &pubkey2, privkey) == 1);
        CHECK(secp256k1_memcmp_var(&pubkey, &pubkey2, sizeof(pubkey)) == 0);
    }

    /* Optionally tweak the keys using multiplication. */
    if (secp256k1_testrand_int(3) == 0) {
        int ret1;
        int ret2;
        int ret3;
        unsigned char rnd[32];
        unsigned char privkey_tmp[32];
        secp256k1_pubkey pubkey2;
        secp256k1_testrand256_test(rnd);
        memcpy(privkey_tmp, privkey, 32);
        ret1 = secp256k1_ec_seckey_tweak_mul(CTX, privkey, rnd);
        ret2 = secp256k1_ec_pubkey_tweak_mul(CTX, &pubkey, rnd);
        /* Check that privkey alias gives same result */
        ret3 = secp256k1_ec_privkey_tweak_mul(CTX, privkey_tmp, rnd);
        CHECK(ret1 == ret2);
        CHECK(ret2 == ret3);
        if (ret1 == 0) {
            return;
        }
        CHECK(secp256k1_memcmp_var(privkey, privkey_tmp, 32) == 0);
        CHECK(secp256k1_ec_pubkey_create(CTX, &pubkey2, privkey) == 1);
        CHECK(secp256k1_memcmp_var(&pubkey, &pubkey2, sizeof(pubkey)) == 0);
    }

    /* Sign. */
    CHECK(secp256k1_ecdsa_sign(CTX, &signature[0], message, privkey, NULL, NULL) == 1);
    CHECK(secp256k1_ecdsa_sign(CTX, &signature[4], message, privkey, NULL, NULL) == 1);
    CHECK(secp256k1_ecdsa_sign(CTX, &signature[1], message, privkey, NULL, extra) == 1);
    extra[31] = 1;
    CHECK(secp256k1_ecdsa_sign(CTX, &signature[2], message, privkey, NULL, extra) == 1);
    extra[31] = 0;
    extra[0] = 1;
    CHECK(secp256k1_ecdsa_sign(CTX, &signature[3], message, privkey, NULL, extra) == 1);
    CHECK(secp256k1_memcmp_var(&signature[0], &signature[4], sizeof(signature[0])) == 0);
    CHECK(secp256k1_memcmp_var(&signature[0], &signature[1], sizeof(signature[0])) != 0);
    CHECK(secp256k1_memcmp_var(&signature[0], &signature[2], sizeof(signature[0])) != 0);
    CHECK(secp256k1_memcmp_var(&signature[0], &signature[3], sizeof(signature[0])) != 0);
    CHECK(secp256k1_memcmp_var(&signature[1], &signature[2], sizeof(signature[0])) != 0);
    CHECK(secp256k1_memcmp_var(&signature[1], &signature[3], sizeof(signature[0])) != 0);
    CHECK(secp256k1_memcmp_var(&signature[2], &signature[3], sizeof(signature[0])) != 0);
    /* Verify. */
    CHECK(secp256k1_ecdsa_verify(CTX, &signature[0], message, &pubkey) == 1);
    CHECK(secp256k1_ecdsa_verify(CTX, &signature[1], message, &pubkey) == 1);
    CHECK(secp256k1_ecdsa_verify(CTX, &signature[2], message, &pubkey) == 1);
    CHECK(secp256k1_ecdsa_verify(CTX, &signature[3], message, &pubkey) == 1);
    /* Test lower-S form, malleate, verify and fail, test again, malleate again */
    CHECK(!secp256k1_ecdsa_signature_normalize(CTX, NULL, &signature[0]));
    secp256k1_ecdsa_signature_load(CTX, &r, &s, &signature[0]);
    secp256k1_scalar_negate(&s, &s);
    secp256k1_ecdsa_signature_save(&signature[5], &r, &s);
    CHECK(secp256k1_ecdsa_verify(CTX, &signature[5], message, &pubkey) == 0);
    CHECK(secp256k1_ecdsa_signature_normalize(CTX, NULL, &signature[5]));
    CHECK(secp256k1_ecdsa_signature_normalize(CTX, &signature[5], &signature[5]));
    CHECK(!secp256k1_ecdsa_signature_normalize(CTX, NULL, &signature[5]));
    CHECK(!secp256k1_ecdsa_signature_normalize(CTX, &signature[5], &signature[5]));
    CHECK(secp256k1_ecdsa_verify(CTX, &signature[5], message, &pubkey) == 1);
    secp256k1_scalar_negate(&s, &s);
    secp256k1_ecdsa_signature_save(&signature[5], &r, &s);
    CHECK(!secp256k1_ecdsa_signature_normalize(CTX, NULL, &signature[5]));
    CHECK(secp256k1_ecdsa_verify(CTX, &signature[5], message, &pubkey) == 1);
    CHECK(secp256k1_memcmp_var(&signature[5], &signature[0], 64) == 0);

    /* Serialize/parse DER and verify again */
    CHECK(secp256k1_ecdsa_signature_serialize_der(CTX, sig, &siglen, &signature[0]) == 1);
    memset(&signature[0], 0, sizeof(signature[0]));
    CHECK(secp256k1_ecdsa_signature_parse_der(CTX, &signature[0], sig, siglen) == 1);
    CHECK(secp256k1_ecdsa_verify(CTX, &signature[0], message, &pubkey) == 1);
    /* Serialize/destroy/parse DER and verify again. */
    siglen = 74;
    CHECK(secp256k1_ecdsa_signature_serialize_der(CTX, sig, &siglen, &signature[0]) == 1);
    sig[secp256k1_testrand_int(siglen)] += 1 + secp256k1_testrand_int(255);
    CHECK(secp256k1_ecdsa_signature_parse_der(CTX, &signature[0], sig, siglen) == 0 ||
          secp256k1_ecdsa_verify(CTX, &signature[0], message, &pubkey) == 0);
}